

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O2

Expression * __thiscall
wasm::anon_unknown_173::FunctionOptimizer::makeExpression<wasm::StructGet>
          (FunctionOptimizer *this,PossibleConstantValues *info,HeapType type,StructGet *curr)

{
  bool *this_00;
  bool bVar1;
  Expression *pEVar2;
  Block *value;
  Drop *left;
  Module *wasm;
  optional<wasm::Type> type_00;
  undefined1 local_50 [8];
  optional<wasm::Field> field;
  Builder builder;
  
  pEVar2 = PossibleConstantValues::makeExpression
                     (info,(this->
                           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                           ).
                           super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                           .currModule);
  GCTypeUtils::getField((optional<wasm::Field> *)local_50,type,curr->index);
  if (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Field>._M_payload.field2[8] != '\0') {
    wasm = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           .currModule;
    value = (Block *)Bits::makePackedFieldGet(pEVar2,(Field *)local_50,curr->signed_,wasm);
    bVar1 = wasm::Type::isSubType
                      ((Type)(value->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type.id,(Type)local_50);
    if (!bVar1) {
      field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Field>._16_8_ =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           .currModule;
      this_00 = &field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Field>._M_engaged;
      left = Builder::makeDrop((Builder *)this_00,(Expression *)value);
      pEVar2 = (Expression *)
               MixedArena::alloc<wasm::Unreachable>
                         ((MixedArena *)
                          (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Field>._16_8_ + 0x200));
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)wasm;
      value = Builder::makeSequence((Builder *)this_00,(Expression *)left,pEVar2,type_00);
    }
    return (Expression *)value;
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/ConstantFieldPropagation.cpp"
                ,0x8f,
                "Expression *wasm::(anonymous namespace)::FunctionOptimizer::makeExpression(const PossibleConstantValues &, HeapType, T *) [T = wasm::StructGet]"
               );
}

Assistant:

Expression*
  makeExpression(const PossibleConstantValues& info, HeapType type, T* curr) {
    auto* value = info.makeExpression(*getModule());
    auto field = GCTypeUtils::getField(type, curr->index);
    assert(field);
    // Apply packing, if needed.
    if constexpr (std::is_same_v<T, StructGet>) {
      value =
        Bits::makePackedFieldGet(value, *field, curr->signed_, *getModule());
    }
    // Check if the value makes sense. The analysis below flows values around
    // without considering where they are placed, that is, when we see a parent
    // type can contain a value in a field then we assume a child may as well
    // (which in general it can, e.g., using a reference to the parent, we can
    // write that value to it, but the reference might actually point to a
    // child instance). If we tracked the types of fields then we might avoid
    // flowing values into places they cannot reside, like when a child field is
    // a subtype, and so we could ignore things not refined enough for it (GUFA
    // does a better job at this). For here, just check we do not break
    // validation, and if we do, then we've inferred the only possible value is
    // an impossible one, making the code unreachable.
    if (!Type::isSubType(value->type, field->type)) {
      Builder builder(*getModule());
      value = builder.makeSequence(builder.makeDrop(value),
                                   builder.makeUnreachable());
    }
    return value;
  }